

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
(anonymous_namespace)::ClangShellCommand::processDiscoveredDependencies(llbuild::core::
TaskInterface,llbuild::basic::QueueJobContext*)::DepsActions::error(llvm::StringRef_unsigned_long_
          (void *this,StringRef message,uint64_t position)

{
  undefined8 uVar1;
  BuildSystemImpl *this_00;
  BuildSystemDelegate *pBVar2;
  undefined8 uVar3;
  TaskInterface ti;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined8 local_58;
  anon_unknown_dwarf_60e82 *local_48;
  void *local_40;
  uint64_t local_38;
  uint64_t position_local;
  DepsActions *this_local;
  StringRef message_local;
  
  ti.ctx = (char *)message.Length;
  this_local = (DepsActions *)message.Data;
  local_48 = *(anon_unknown_dwarf_60e82 **)((long)this + 8);
  local_40 = *(void **)((long)this + 0x10);
  ti.impl = local_40;
  local_38 = position;
  position_local = (uint64_t)this;
  message_local.Data = ti.ctx;
  this_00 = anon_unknown.dwarf_60e82::getBuildSystem(local_48,ti);
  pBVar2 = anon_unknown.dwarf_60e82::BuildSystemImpl::getDelegate(this_00);
  uVar1 = *(undefined8 *)((long)this + 0x18);
  std::operator+(&local_b8,"error reading dependency file \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (*(long *)((long)this + 0x18) + 0x150));
  std::operator+(&local_98,&local_b8,"\': ");
  llvm::StringRef::str_abi_cxx11_(&local_d8,(StringRef *)&this_local);
  std::operator+(&local_78,&local_98,&local_d8);
  message_local.Length = (size_t)&local_78;
  local_58 = std::__cxx11::string::data();
  uVar3 = std::__cxx11::string::length();
  (*pBVar2->_vptr_BuildSystemDelegate[0xb])(pBVar2,uVar1,local_58,uVar3);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  *(int *)((long)this + 0x20) = *(int *)((long)this + 0x20) + 1;
  return;
}

Assistant:

virtual void error(StringRef message, uint64_t position) override {
        getBuildSystem(ti).getDelegate().commandHadError(command,
                       "error reading dependency file '" + command->depsPath +
                       "': " + message.str());
        ++numErrors;
      }